

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deDefs.cpp
# Opt level: O0

void de::throwRuntimeError(char *message,char *expr,char *file,int line)

{
  ostream *poVar1;
  runtime_error *this;
  char *local_1e0;
  string local_1d0 [48];
  ostringstream local_1a0 [8];
  ostringstream msg;
  int line_local;
  char *file_local;
  char *expr_local;
  char *message_local;
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  local_1e0 = message;
  if (message == (char *)0x0) {
    local_1e0 = "Runtime check failed";
  }
  poVar1 = std::operator<<((ostream *)local_1a0,local_1e0);
  std::operator<<(poVar1,": ");
  if (expr != (char *)0x0) {
    poVar1 = std::operator<<((ostream *)local_1a0,'\'');
    poVar1 = std::operator<<(poVar1,expr);
    std::operator<<(poVar1,'\'');
  }
  poVar1 = std::operator<<((ostream *)local_1a0," at ");
  poVar1 = std::operator<<(poVar1,file);
  poVar1 = std::operator<<(poVar1,":");
  std::ostream::operator<<(poVar1,line);
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::str();
  std::runtime_error::runtime_error(this,local_1d0);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void throwRuntimeError (const char* message, const char* expr, const char* file, int line)
{
	std::ostringstream msg;
	msg << (message ? message : "Runtime check failed") << ": ";
	if (expr)
		msg << '\'' << expr << '\'';
	msg << " at " << file << ":" << line;
	throw std::runtime_error(msg.str());
}